

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O0

void __thiscall
gutil::Properties::putValue<gmath::SVector<double,3>>
          (Properties *this,char *key,SVector<double,_3> *value)

{
  ostringstream out;
  ostringstream *this_00;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffe40;
  ostringstream local_190 [208];
  string *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  Properties *in_stack_ffffffffffffff50;
  
  this_00 = local_190;
  std::__cxx11::ostringstream::ostringstream(this_00);
  gmath::operator<<(in_stack_fffffffffffffe40,(SVector<double,_3> *)this_00);
  std::__cxx11::ostringstream::str();
  putString(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe40);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void putValue(const char *key, const T &value)
    {
      std::ostringstream out;
      out << value;
      putString(key, out.str());
    }